

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_sint.hpp
# Opt level: O2

void ans_sint_decompress(uint32_t *dst,size_t to_decode,uint8_t *cSrc,size_t cSrcSize)

{
  long *plVar1;
  uint64_t *state;
  ulong uVar2;
  uint32_t i;
  uint32_t uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  array<unsigned_long,_4UL> states;
  ans_sint_decode ans_frame;
  uint8_t *local_b8;
  ulong local_b0;
  uint64_t local_a8 [4];
  ans_sint_decode local_88;
  
  ans_sint_decode::load(&local_88,cSrc);
  local_b8 = cSrc + cSrcSize;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    plVar1 = (long *)(local_b8 + -8);
    local_b8 = local_b8 + -8;
    local_a8[lVar4] = *plVar1 + local_88.lower_bound;
  }
  uVar5 = to_decode & 0xfffffffffffffffc;
  state = local_a8 + 3;
  local_b0 = to_decode;
  if (local_88.table_type == SINT_SMALL) {
    for (uVar6 = 0; uVar2 = local_b0, uVar5 != uVar6; uVar6 = uVar6 + 4) {
      uVar3 = ans_sint_decode::decode_sym<dec_entry_sint_small>(&local_88,local_a8,&local_b8);
      dst[uVar6] = uVar3;
      uVar3 = ans_sint_decode::decode_sym<dec_entry_sint_small>(&local_88,local_a8 + 1,&local_b8);
      dst[uVar6 + 1] = uVar3;
      uVar3 = ans_sint_decode::decode_sym<dec_entry_sint_small>(&local_88,local_a8 + 2,&local_b8);
      dst[uVar6 + 2] = uVar3;
      uVar3 = ans_sint_decode::decode_sym<dec_entry_sint_small>(&local_88,state,&local_b8);
      dst[uVar6 + 3] = uVar3;
    }
    for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      uVar3 = ans_sint_decode::decode_sym<dec_entry_sint_small>(&local_88,state,&local_b8);
      dst[uVar5] = uVar3;
    }
  }
  else {
    for (uVar6 = 0; uVar2 = local_b0, uVar5 != uVar6; uVar6 = uVar6 + 4) {
      uVar3 = ans_sint_decode::decode_sym<dec_entry_sint>(&local_88,local_a8,&local_b8);
      dst[uVar6] = uVar3;
      uVar3 = ans_sint_decode::decode_sym<dec_entry_sint>(&local_88,local_a8 + 1,&local_b8);
      dst[uVar6 + 1] = uVar3;
      uVar3 = ans_sint_decode::decode_sym<dec_entry_sint>(&local_88,local_a8 + 2,&local_b8);
      dst[uVar6 + 2] = uVar3;
      uVar3 = ans_sint_decode::decode_sym<dec_entry_sint>(&local_88,state,&local_b8);
      dst[uVar6 + 3] = uVar3;
    }
    for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      uVar3 = ans_sint_decode::decode_sym<dec_entry_sint>(&local_88,state,&local_b8);
      dst[uVar5] = uVar3;
    }
  }
  ans_sint_decode::~ans_sint_decode(&local_88);
  return;
}

Assistant:

void ans_sint_decompress(
    uint32_t* dst, size_t to_decode, const uint8_t* cSrc, size_t cSrcSize)
{
    const uint32_t num_states = 4;
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_sint_decode::load(in_u8);
    in_u8 += cSrcSize;

    std::array<uint64_t, num_states> states;

    for (uint32_t i = 0; i < num_states; i++) {
        states[i] = ans_frame.init_state(in_u8);
    }
    size_t cur_idx = 0;
    auto out_u32 = reinterpret_cast<uint32_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % num_states);
    if (ans_frame.table_type == dec_table_type_sint::SINT_SMALL) {
        while (cur_idx != fast_decode) {
            out_u32[cur_idx]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[0], in_u8);
            out_u32[cur_idx + 1]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[1], in_u8);
            out_u32[cur_idx + 2]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[2], in_u8);
            out_u32[cur_idx + 3]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[3], in_u8);
            cur_idx += num_states;
        }
        while (cur_idx != to_decode) {
            out_u32[cur_idx++] = ans_frame.decode_sym<dec_entry_sint_small>(
                states[num_states - 1], in_u8);
        }
    } else {
        while (cur_idx != fast_decode) {
            out_u32[cur_idx]
                = ans_frame.decode_sym<dec_entry_sint>(states[0], in_u8);
            out_u32[cur_idx + 1]
                = ans_frame.decode_sym<dec_entry_sint>(states[1], in_u8);
            out_u32[cur_idx + 2]
                = ans_frame.decode_sym<dec_entry_sint>(states[2], in_u8);
            out_u32[cur_idx + 3]
                = ans_frame.decode_sym<dec_entry_sint>(states[3], in_u8);
            cur_idx += num_states;
        }
        while (cur_idx != to_decode) {
            out_u32[cur_idx++] = ans_frame.decode_sym<dec_entry_sint>(
                states[num_states - 1], in_u8);
        }
    }
}